

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptNativeFloatArray::SetItem(JavascriptNativeFloatArray *this,uint32 index,double dValue)

{
  JavascriptArray *this_00;
  ScriptContext *scriptContext;
  Var newValue;
  JavascriptArray *varArr;
  double dValue_local;
  uint32 index_local;
  JavascriptNativeFloatArray *this_local;
  
  if (dValue == MissingItem) {
    this_00 = ToVarArray(this);
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    newValue = JavascriptNumber::ToVarNoCheck(dValue,scriptContext);
    Js::JavascriptArray::DirectSetItemAt<void*>(this_00,index,newValue);
  }
  else {
    Js::JavascriptArray::DirectSetItemAt<double>((JavascriptArray *)this,index,dValue);
  }
  return 1;
}

Assistant:

BOOL JavascriptNativeFloatArray::SetItem(uint32 index, double dValue)
    {
        if (*(uint64*)&dValue == *(uint64*)&JavascriptNativeFloatArray::MissingItem)
        {
            JavascriptArray *varArr = JavascriptNativeFloatArray::ToVarArray(this);
            varArr->DirectSetItemAt(index, JavascriptNumber::ToVarNoCheck(dValue, GetScriptContext()));
            return TRUE;
        }

        this->DirectSetItemAt<double>(index, dValue);
        return TRUE;
    }